

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cobs.h
# Opt level: O0

size_t cobs_decode(uint8_t *input,size_t length,uint8_t *output)

{
  byte bVar1;
  byte local_3a;
  uint8_t i;
  size_t sStack_38;
  uint8_t code;
  size_t write_index;
  size_t read_index;
  uint8_t *output_local;
  size_t length_local;
  uint8_t *input_local;
  
  write_index = 0;
  sStack_38 = 0;
  while( true ) {
    if (length <= write_index) {
      return sStack_38;
    }
    bVar1 = input[write_index];
    if ((length < write_index + bVar1) && (bVar1 != 1)) break;
    for (local_3a = 1; write_index = write_index + 1, local_3a < bVar1; local_3a = local_3a + 1) {
      output[sStack_38] = input[write_index];
      sStack_38 = sStack_38 + 1;
    }
    if ((bVar1 != 0xff) && (write_index != length)) {
      output[sStack_38] = '\0';
      sStack_38 = sStack_38 + 1;
    }
  }
  return 0;
}

Assistant:

size_t cobs_decode(const uint8_t *  input, size_t length, uint8_t *  output)
{
  size_t read_index = 0;
  size_t write_index = 0;
  uint8_t code;


  while(read_index < length)
  {
    code = input[read_index];

    if(read_index + code > length && code != 1)
    {
      return 0;
    }

    read_index++;

    for(uint8_t i = 1; i < code; i++)
    {
      output[write_index++] = input[read_index++];
    }

    if(code != 0xFF && read_index != length)
    {
      output[write_index++] = '\0';
    }
  }

  return write_index;
}